

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsfe_Emu.cpp
# Opt level: O2

blargg_err_t __thiscall Nsfe_File::load_(Nsfe_File *this,Data_Reader *in)

{
  blargg_err_t pcVar1;
  byte bVar2;
  
  pcVar1 = Nsfe_Info::load(&this->info,in,(Nsf_Emu *)0x0);
  if (pcVar1 == (blargg_err_t)0x0) {
    (this->info).playlist_disabled = false;
    bVar2 = (byte)(this->info).playlist.size_;
    (this->info).info.super_header_t.track_count = bVar2;
    if (bVar2 == 0) {
      bVar2 = (byte)(this->info).actual_track_count_;
      (this->info).info.super_header_t.track_count = bVar2;
    }
    (this->super_Gme_Info_).super_Music_Emu.super_Gme_File.raw_track_count_ = (uint)bVar2;
    (this->super_Gme_Info_).super_Music_Emu.super_Gme_File.track_count_ = (uint)bVar2;
  }
  return pcVar1;
}

Assistant:

blargg_err_t load_( Data_Reader& in )
	{
		RETURN_ERR( info.load( in, 0 ) );
		info.disable_playlist( false );
		set_track_count( info.info.track_count );
		return 0;
	}